

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  jpeg_entropy_decoder *pjVar2;
  JBLOCKROW paJVar3;
  long lVar4;
  jpeg_error_mgr *pjVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uchar *st;
  uint local_4c;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar8 = *(int *)((long)&pjVar2[3].start_pass + 4);
    if (iVar8 == 0) {
      process_restart(cinfo);
      iVar8 = *(int *)((long)&pjVar2[3].start_pass + 4);
    }
    *(int *)((long)&pjVar2[3].start_pass + 4) = iVar8 + -1;
  }
  if (pjVar2[1].insufficient_data != -1) {
    paJVar3 = *MCU_data;
    bVar1 = (byte)cinfo->Al;
    iVar8 = cinfo->cur_comp_info[0]->ac_tbl_no;
    uVar9 = cinfo->Se;
    uVar12 = uVar9;
    while ((local_4c = (int)uVar9 >> 0x1f & uVar9, 0 < (int)uVar12 &&
           (local_4c = uVar12, (*paJVar3)[jpeg_natural_order[uVar12]] == 0))) {
      uVar12 = uVar12 - 1;
    }
    iVar14 = cinfo->Ss;
    while (iVar14 <= (int)uVar9) {
      lVar4 = *(long *)(&pjVar2[8].insufficient_data + (long)iVar8 * 2);
      lVar15 = (long)(iVar14 * 3 + -3);
      if (((int)local_4c < iVar14) &&
         (iVar10 = arith_decode(cinfo,(uchar *)(lVar4 + lVar15)), iVar10 != 0)) {
        return 1;
      }
      lVar13 = (long)iVar14 + -1;
      st = (uchar *)(lVar15 + lVar4 + 2);
      while( true ) {
        iVar14 = iVar14 + 1;
        iVar10 = jpeg_natural_order[lVar13 + 1];
        sVar7 = (short)(1 << (bVar1 & 0x1f));
        sVar6 = (short)(-1 << (bVar1 & 0x1f));
        if ((*paJVar3)[iVar10] != 0) break;
        iVar11 = arith_decode(cinfo,st + -1);
        if (iVar11 != 0) {
          iVar11 = arith_decode(cinfo,(uchar *)(pjVar2 + 0xe));
          if (iVar11 != 0) {
            sVar7 = sVar6;
          }
          (*paJVar3)[iVar10] = sVar7;
          goto LAB_00133076;
        }
        lVar13 = lVar13 + 1;
        st = st + 3;
        if (cinfo->Se <= lVar13) {
          pjVar5 = cinfo->err;
          pjVar5->msg_code = 0x7e;
          (*pjVar5->emit_message)((j_common_ptr)cinfo,-1);
          pjVar2[1].insufficient_data = -1;
          return 1;
        }
      }
      iVar11 = arith_decode(cinfo,st);
      if (iVar11 != 0) {
        if (-1 < (*paJVar3)[iVar10]) {
          sVar6 = sVar7;
        }
        (*paJVar3)[iVar10] = (*paJVar3)[iVar10] + sVar6;
      }
LAB_00133076:
      uVar9 = cinfo->Se;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;          /* 1 in the bit position being coded */
  m1 = (NEG_1) << cinfo->Al;    /* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[jpeg_natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
    for (;;) {
      thiscoef = *block + jpeg_natural_order[k];
      if (*thiscoef) {                          /* previously nonzero coef */
        if (arith_decode(cinfo, st + 2)) {
          if (*thiscoef < 0)
            *thiscoef += m1;
          else
            *thiscoef += p1;
        }
        break;
      }
      if (arith_decode(cinfo, st + 1)) {        /* newly nonzero coef */
        if (arith_decode(cinfo, entropy->fixed_bin))
          *thiscoef = m1;
        else
          *thiscoef = p1;
        break;
      }
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
  }

  return TRUE;
}